

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexHullShape.cpp
# Opt level: O2

void __thiscall
cbtConvexHullShape::batchedUnitVectorGetSupportingVertexWithoutMargin
          (cbtConvexHullShape *this,cbtVector3 *vectors,cbtVector3 *supportVerticesOut,
          int numVectors)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  long lVar4;
  long lVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar9;
  cbtScalar newDot;
  cbtVector3 vec;
  cbtScalar local_44;
  cbtVector3 local_40;
  
  lVar5 = (ulong)(uint)(~(numVectors >> 0x1f) & numVectors) << 4;
  for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 0x10) {
    *(undefined4 *)((long)supportVerticesOut->m_floats + lVar3 + 0xc) = 0xdd5e0b6b;
  }
  for (lVar3 = 0; auVar8 = in_ZMM0._8_56_, lVar5 != lVar3; lVar3 = lVar3 + 0x10) {
    cVar9 = ::operator*((cbtVector3 *)((long)vectors->m_floats + lVar3),
                        (cbtVector3 *)
                        &(this->super_cbtPolyhedralConvexAabbCachingShape).
                         super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                         super_cbtConvexShape.super_cbtCollisionShape.field_0x1c);
    auVar6._0_8_ = cVar9.m_floats._0_8_;
    auVar6._8_56_ = auVar8;
    auVar1._8_8_ = in_XMM1_Qb;
    auVar1._0_8_ = cVar9.m_floats._8_8_;
    local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar6._0_16_,auVar1);
    in_ZMM0 = ZEXT1664((undefined1  [16])local_40.m_floats);
    auVar8 = ZEXT856(local_40.m_floats._8_8_);
    lVar4 = (long)(this->m_unscaledPoints).m_size;
    if (lVar4 < 1) {
      *(undefined4 *)((long)supportVerticesOut->m_floats + lVar3 + 0xc) = 0xdd5e0b6b;
    }
    else {
      lVar4 = cbtVector3::maxDot(&local_40,(this->m_unscaledPoints).m_data,lVar4,&local_44);
      cVar9 = getScaledPoint(this,(int)lVar4);
      auVar7._0_8_ = cVar9.m_floats._0_8_;
      auVar7._8_56_ = auVar8;
      auVar2._8_8_ = in_XMM1_Qb;
      auVar2._0_8_ = cVar9.m_floats._8_8_;
      auVar1 = vmovlhps_avx(auVar7._0_16_,auVar2);
      *(undefined1 (*) [16])((long)supportVerticesOut->m_floats + lVar3) = auVar1;
      in_ZMM0 = ZEXT464((uint)local_44);
      *(cbtScalar *)((long)supportVerticesOut->m_floats + lVar3 + 0xc) = local_44;
    }
  }
  return;
}

Assistant:

void cbtConvexHullShape::batchedUnitVectorGetSupportingVertexWithoutMargin(const cbtVector3* vectors, cbtVector3* supportVerticesOut, int numVectors) const
{
	cbtScalar newDot;
	//use 'w' component of supportVerticesOut?
	{
		for (int i = 0; i < numVectors; i++)
		{
			supportVerticesOut[i][3] = cbtScalar(-BT_LARGE_FLOAT);
		}
	}

	for (int j = 0; j < numVectors; j++)
	{
		cbtVector3 vec = vectors[j] * m_localScaling;  // dot(a*b,c) = dot(a,b*c)
		if (0 < m_unscaledPoints.size())
		{
			int i = (int)vec.maxDot(&m_unscaledPoints[0], m_unscaledPoints.size(), newDot);
			supportVerticesOut[j] = getScaledPoint(i);
			supportVerticesOut[j][3] = newDot;
		}
		else
			supportVerticesOut[j][3] = -BT_LARGE_FLOAT;
	}
}